

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midiprobe.cpp
# Opt level: O2

int main(void)

{
  RtMidiIn *this;
  mapped_type *pmVar1;
  ostream *poVar2;
  RtMidiOut *this_00;
  uint uVar3;
  ulong uVar4;
  allocator<char> local_a1;
  RtMidiIn *local_a0;
  string portName;
  vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> apis;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  apiMap;
  
  apiMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &apiMap._M_t._M_impl.super__Rb_tree_header._M_header;
  apiMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  apiMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  apiMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  portName._M_dataplus._M_p._0_4_ = 1;
  apiMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       apiMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&apiMap,(key_type *)&portName);
  std::__cxx11::string::assign((char *)pmVar1);
  portName._M_dataplus._M_p._0_4_ = 4;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&apiMap,(key_type *)&portName);
  std::__cxx11::string::assign((char *)pmVar1);
  portName._M_dataplus._M_p._0_4_ = 3;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&apiMap,(key_type *)&portName);
  std::__cxx11::string::assign((char *)pmVar1);
  portName._M_dataplus._M_p._0_4_ = 2;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&apiMap,(key_type *)&portName);
  std::__cxx11::string::assign((char *)pmVar1);
  portName._M_dataplus._M_p._0_4_ = RTMIDI_DUMMY;
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&apiMap,(key_type *)&portName);
  std::__cxx11::string::assign((char *)pmVar1);
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  RtMidi::getCompiledApi((vector *)&apis);
  std::operator<<((ostream *)&std::cout,"\nCompiled APIs:\n");
  for (uVar3 = 0;
      (ulong)uVar3 <
      (ulong)((long)apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2); uVar3 = uVar3 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"  ");
    portName._M_dataplus._M_p._0_4_ =
         apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>._M_impl.
         super__Vector_impl_data._M_start[uVar3];
    pmVar1 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&apiMap,(key_type *)&portName);
    poVar2 = std::operator<<(poVar2,(string *)pmVar1);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  local_a0 = (RtMidiIn *)operator_new(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&portName,"RtMidi Input Client",&local_a1);
  this = local_a0;
  RtMidiIn::RtMidiIn(local_a0,UNSPECIFIED,(string *)&portName,100);
  std::__cxx11::string::~string((string *)&portName);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nCurrent input API: ");
  portName._M_dataplus._M_p._0_4_ = RtMidiIn::getCurrentApi(this);
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&apiMap,(key_type *)&portName);
  poVar2 = std::operator<<(poVar2,(string *)pmVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar3 = (**(code **)(*(long *)local_a0 + 0x10))();
  poVar2 = std::operator<<((ostream *)&std::cout,"\nThere are ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," MIDI input sources available.\n");
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    (**(code **)(*(long *)local_a0 + 0x18))(&portName,local_a0,uVar4 & 0xffffffff);
    poVar2 = std::operator<<((ostream *)&std::cout,"  Input Port #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,(string *)&portName);
    std::operator<<(poVar2,'\n');
    std::__cxx11::string::~string((string *)&portName);
  }
  this_00 = (RtMidiOut *)operator_new(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&portName,"RtMidi Output Client",&local_a1);
  RtMidiOut::RtMidiOut(this_00,UNSPECIFIED,(string *)&portName);
  std::__cxx11::string::~string((string *)&portName);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nCurrent output API: ");
  portName._M_dataplus._M_p._0_4_ = RtMidiOut::getCurrentApi(this_00);
  pmVar1 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&apiMap,(key_type *)&portName);
  poVar2 = std::operator<<(poVar2,(string *)pmVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  uVar3 = (**(code **)(*(long *)this_00 + 0x10))(this_00);
  poVar2 = std::operator<<((ostream *)&std::cout,"\nThere are ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::operator<<(poVar2," MIDI output ports available.\n");
  for (uVar4 = 0; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    (**(code **)(*(long *)this_00 + 0x18))(&portName,this_00,uVar4 & 0xffffffff);
    poVar2 = std::operator<<((ostream *)&std::cout,"  Output Port #");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = std::operator<<(poVar2,(string *)&portName);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::~string((string *)&portName);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  (**(code **)(*(long *)local_a0 + 0x40))();
  if (this_00 != (RtMidiOut *)0x0) {
    (**(code **)(*(long *)this_00 + 0x40))(this_00);
  }
  std::_Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>::~_Vector_base
            (&apis.super__Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&apiMap._M_t);
  return 0;
}

Assistant:

int main()
{
  // Create an api map.
  std::map<int, std::string> apiMap;
  apiMap[RtMidi::MACOSX_CORE] = "OS-X CoreMIDI";
  apiMap[RtMidi::WINDOWS_MM] = "Windows MultiMedia";
  apiMap[RtMidi::UNIX_JACK] = "Jack Client";
  apiMap[RtMidi::LINUX_ALSA] = "Linux ALSA";
  apiMap[RtMidi::RTMIDI_DUMMY] = "RtMidi Dummy";

  std::vector< RtMidi::Api > apis;
  RtMidi :: getCompiledApi( apis );

  std::cout << "\nCompiled APIs:\n";
  for ( unsigned int i=0; i<apis.size(); i++ )
    std::cout << "  " << apiMap[ apis[i] ] << std::endl;

  RtMidiIn  *midiin = 0;
  RtMidiOut *midiout = 0;

  try {

    // RtMidiIn constructor ... exception possible
    midiin = new RtMidiIn();

    std::cout << "\nCurrent input API: " << apiMap[ midiin->getCurrentApi() ] << std::endl;

    // Check inputs.
    unsigned int nPorts = midiin->getPortCount();
    std::cout << "\nThere are " << nPorts << " MIDI input sources available.\n";

    for ( unsigned i=0; i<nPorts; i++ ) {
      std::string portName = midiin->getPortName(i);
      std::cout << "  Input Port #" << i << ": " << portName << '\n';
    }

    // RtMidiOut constructor ... exception possible
    midiout = new RtMidiOut();

    std::cout << "\nCurrent output API: " << apiMap[ midiout->getCurrentApi() ] << std::endl;

    // Check outputs.
    nPorts = midiout->getPortCount();
    std::cout << "\nThere are " << nPorts << " MIDI output ports available.\n";

    for ( unsigned i=0; i<nPorts; i++ ) {
      std::string portName = midiout->getPortName(i);
      std::cout << "  Output Port #" << i << ": " << portName << std::endl;
    }
    std::cout << std::endl;

  } catch ( RtMidiError &error ) {
    error.printMessage();
  }

  delete midiin;
  delete midiout;

  return 0;
}